

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLOptionsHelper::split
            (string *s,char delim,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *elems)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  char in_SIL;
  string *in_RDI;
  string item;
  stringstream ss;
  undefined7 in_stack_fffffffffffffe18;
  string local_1c0 [32];
  stringstream local_1a0 [392];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  char local_9;
  
  local_18 = in_RDX;
  local_9 = in_SIL;
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,in_RDI,_Var2);
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    this = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_1a0,local_1c0,local_9);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(this + *(long *)(*(long *)this + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)CONCAT17(bVar1,in_stack_fffffffffffffe18));
  }
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return local_18;
}

Assistant:

inline std::vector<std::string> &split(const std::string &s, char delim, std::vector<std::string> &elems) {
        std::stringstream ss(s);
        std::string item=std::string();
        while (std::getline(ss, item, delim)) {
            elems.push_back(item);
        }
        return elems;
    }